

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_io.c
# Opt level: O3

int CVodeGetStgrSensNumNonlinSolvConvFails(void *cvode_mem,long *nSTGR1nfails)

{
  uint uVar1;
  long lVar2;
  int line;
  ulong uVar3;
  int iVar4;
  int error_code;
  char *msgfmt;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    iVar4 = -0x15;
    cvode_mem = (CVodeMem)0x0;
    error_code = -0x15;
    line = 0x979;
  }
  else {
    if (*(int *)((long)cvode_mem + 0x8c) != 0) {
      uVar1 = *(uint *)((long)cvode_mem + 0x90);
      if ((int)uVar1 < 1 || *(int *)((long)cvode_mem + 0x94) != 3) {
        return 0;
      }
      lVar2 = *(long *)((long)cvode_mem + 0x6a0);
      uVar3 = 0;
      do {
        nSTGR1nfails[uVar3] = *(long *)(lVar2 + uVar3 * 8);
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
      return 0;
    }
    msgfmt = "Forward sensitivity analysis not activated.";
    iVar4 = -0x28;
    error_code = -0x28;
    line = 0x983;
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,line,"CVodeGetStgrSensNumNonlinSolvConvFails",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_io.c"
                 ,msgfmt);
  return iVar4;
}

Assistant:

int CVodeGetStgrSensNumNonlinSolvConvFails(void* cvode_mem, long int* nSTGR1nfails)
{
  CVodeMem cv_mem;
  int is, Ns;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem)cvode_mem;

  Ns = cv_mem->cv_Ns;

  if (cv_mem->cv_sensi == SUNFALSE)
  {
    cvProcessError(cv_mem, CV_NO_SENS, __LINE__, __func__, __FILE__,
                   MSGCV_NO_SENSI);
    return (CV_NO_SENS);
  }

  if (cv_mem->cv_ism == CV_STAGGERED1)
  {
    for (is = 0; is < Ns; is++) { nSTGR1nfails[is] = cv_mem->cv_nnfS1[is]; }
  }

  return (CV_SUCCESS);
}